

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O3

int symamd(int n,int *A,int *p,int *perm,double *knobs,int *stats,
          _func_void_ptr_size_t_size_t *allocate,_func_void_void_ptr *release)

{
  uint uVar1;
  void *pvVar2;
  void *__s;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  double cknobs [20];
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  undefined1 local_160 [136];
  double local_d8;
  double local_d0;
  
  if (stats != (int *)0x0) {
    stats[4] = 0;
    stats[5] = 0;
    stats[6] = 0;
    stats[7] = 0;
    stats[0x10] = 0;
    stats[0x11] = 0;
    stats[0x12] = 0;
    stats[0x13] = 0;
    stats[0xc] = 0;
    stats[0xd] = 0;
    stats[0xe] = 0;
    stats[0xf] = 0;
    stats[8] = 0;
    stats[9] = 0;
    stats[10] = 0;
    stats[0xb] = 0;
    stats[0] = 0;
    stats[1] = 0;
    stats[2] = 0;
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
    }
    else if (n < 0) {
      stats[3] = -4;
      stats[4] = n;
    }
    else {
      uVar10 = (ulong)(uint)n;
      iVar8 = p[uVar10];
      if (iVar8 < 0) {
        stats[3] = -5;
      }
      else {
        if (*p == 0) {
          if (knobs == (double *)0x0) {
            memset(local_160,0,0x88);
            local_178 = 0;
            uStack_174 = 0x40240000;
            uStack_170 = 0;
            uStack_16c = 0x40240000;
            local_168 = 0x3ff0000000000000;
            knobs = (double *)&local_178;
          }
          sVar5 = (long)n + 1;
          pvVar2 = (*allocate)(sVar5,4);
          if (pvVar2 == (void *)0x0) {
            stats[3] = -10;
            return 0;
          }
          __s = (*allocate)(sVar5,4);
          if (__s == (void *)0x0) {
            stats[3] = -10;
            (*release)(pvVar2);
            return 0;
          }
          stats[6] = 0;
          if (n == 0) {
            *perm = 0;
          }
          else {
            memset(__s,0xff,uVar10 * 4);
            uVar7 = (ulong)(uint)*p;
            uVar4 = 0;
            do {
              uVar3 = uVar4 + 1;
              uVar1 = p[uVar4 + 1];
              uVar15 = (ulong)uVar1;
              iVar9 = (int)uVar7;
              iVar12 = uVar1 - iVar9;
              iVar8 = (int)uVar4;
              if (iVar12 < 0) {
                stats[3] = -8;
                stats[4] = iVar8;
                stats[5] = iVar12;
LAB_0010f51a:
                (*release)(pvVar2);
                (*release)(__s);
                return 0;
              }
              if (iVar12 != 0 && iVar9 <= (int)uVar1) {
                lVar11 = (long)iVar9;
                uVar7 = 0xffffffff;
                do {
                  uVar1 = A[lVar11];
                  uVar13 = (ulong)uVar1;
                  if ((uint)n <= uVar1) {
                    stats[3] = -9;
                    stats[4] = iVar8;
                    stats[5] = uVar1;
                    stats[6] = n;
                    goto LAB_0010f51a;
                  }
                  if (((int)uVar1 <= (int)uVar7) || (uVar4 == *(uint *)((long)__s + uVar13 * 4))) {
                    stats[3] = 1;
                    stats[4] = iVar8;
                    stats[5] = uVar1;
                    stats[6] = stats[6] + 1;
                  }
                  if (((long)uVar4 < (long)(int)uVar1) &&
                     (uVar4 != *(uint *)((long)__s + uVar13 * 4))) {
                    piVar6 = (int *)((long)pvVar2 + uVar13 * 4);
                    *piVar6 = *piVar6 + 1;
                    piVar6 = (int *)((long)pvVar2 + uVar4 * 4);
                    *piVar6 = *piVar6 + 1;
                  }
                  *(int *)((long)__s + uVar13 * 4) = iVar8;
                  lVar11 = lVar11 + 1;
                  uVar15 = (ulong)p[uVar3];
                  uVar7 = uVar13;
                } while (lVar11 < (long)uVar15);
              }
              uVar7 = uVar15 & 0xffffffff;
              uVar4 = uVar3;
            } while (uVar3 != uVar10);
            *perm = 0;
            if (n != 0) {
              uVar4 = 0;
              iVar8 = 0;
              do {
                iVar8 = iVar8 + *(int *)((long)pvVar2 + uVar4 * 4);
                perm[uVar4 + 1] = iVar8;
                uVar4 = uVar4 + 1;
              } while (uVar10 != uVar4);
              if (n != 0) {
                uVar4 = 0;
                do {
                  *(int *)((long)pvVar2 + uVar4 * 4) = perm[uVar4];
                  uVar4 = uVar4 + 1;
                } while (uVar10 != uVar4);
              }
            }
          }
          iVar8 = perm[uVar10] / 2;
          sVar5 = colamd_recommended(perm[uVar10],iVar8,n);
          piVar6 = (int *)(*allocate)(sVar5,4);
          if (piVar6 != (int *)0x0) {
            if (stats[3] == 0) {
              if (n != 0) {
                iVar9 = *p;
                iVar12 = 0;
                uVar4 = 0;
                do {
                  uVar7 = uVar4 + 1;
                  iVar14 = p[uVar4 + 1];
                  if (iVar9 < iVar14) {
                    lVar11 = (long)iVar9;
                    do {
                      lVar16 = (long)A[lVar11];
                      if ((long)uVar4 < lVar16) {
                        iVar9 = *(int *)((long)pvVar2 + lVar16 * 4);
                        *(int *)((long)pvVar2 + lVar16 * 4) = iVar9 + 1;
                        piVar6[iVar9] = iVar12;
                        iVar9 = *(int *)((long)pvVar2 + uVar4 * 4);
                        *(int *)((long)pvVar2 + uVar4 * 4) = iVar9 + 1;
                        piVar6[iVar9] = iVar12;
                        iVar12 = iVar12 + 1;
                        iVar14 = p[uVar7];
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 < iVar14);
                  }
                  iVar9 = iVar14;
                  uVar4 = uVar7;
                } while (uVar7 != uVar10);
              }
            }
            else if (n != 0) {
              memset(__s,0xff,uVar10 * 4);
              iVar9 = *p;
              iVar12 = 0;
              uVar4 = 0;
              do {
                uVar7 = uVar4 + 1;
                iVar14 = p[uVar4 + 1];
                if (iVar9 < iVar14) {
                  lVar11 = (long)iVar9;
                  do {
                    lVar16 = (long)A[lVar11];
                    if (((long)uVar4 < lVar16) && (uVar4 != *(uint *)((long)__s + lVar16 * 4))) {
                      iVar9 = *(int *)((long)pvVar2 + lVar16 * 4);
                      *(int *)((long)pvVar2 + lVar16 * 4) = iVar9 + 1;
                      piVar6[iVar9] = iVar12;
                      iVar9 = *(int *)((long)pvVar2 + uVar4 * 4);
                      *(int *)((long)pvVar2 + uVar4 * 4) = iVar9 + 1;
                      piVar6[iVar9] = iVar12;
                      iVar12 = iVar12 + 1;
                      *(int *)((long)__s + lVar16 * 4) = (int)uVar4;
                      iVar14 = p[uVar7];
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < iVar14);
                }
                iVar9 = iVar14;
                uVar4 = uVar7;
              } while (uVar7 != uVar10);
            }
            (*release)(pvVar2);
            (*release)(__s);
            memcpy(&local_d8,knobs,0xa0);
            local_d8 = -1.0;
            local_d0 = *knobs;
            colamd(iVar8,n,(int)sVar5,piVar6,perm,&local_d8,stats);
            *stats = stats[1];
            (*release)(piVar6);
            return 1;
          }
          stats[3] = -10;
          (*release)(pvVar2);
          (*release)(__s);
          return 0;
        }
        stats[3] = -6;
        iVar8 = *p;
      }
      stats[4] = iVar8;
    }
  }
  return 0;
}

Assistant:

PUBLIC Int SYMAMD_MAIN			/* return TRUE if OK, FALSE otherwise */
(
    /* === Parameters ======================================================= */

    Int n,				/* number of rows and columns of A */
    Int A [],				/* row indices of A */
    Int p [],				/* column pointers of A */
    Int perm [],			/* output permutation, size n+1 */
    double knobs [COLAMD_KNOBS],	/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS],		/* output statistics and error codes */
    void * (*allocate) (size_t, size_t),
    					/* pointer to calloc (ANSI C) or */
					/* mxCalloc (for MATLAB mexFunction) */
    void (*release) (void *)
    					/* pointer to free (ANSI C) or */
    					/* mxFree (for MATLAB mexFunction) */
)
{
    /* === Local variables ================================================== */

    Int *count ;		/* length of each column of M, and col pointer*/
    Int *mark ;			/* mark array for finding duplicate entries */
    Int *M ;			/* row indices of matrix M */
    size_t Mlen ;		/* length of M */
    Int n_row ;			/* number of rows in M */
    Int nnz ;			/* number of entries in A */
    Int i ;			/* row index of A */
    Int j ;			/* column index of A */
    Int k ;			/* row index of M */ 
    Int mnz ;			/* number of nonzeros in M */
    Int pp ;			/* index into a column of A */
    Int last_row ;		/* last row seen in the current column */
    Int length ;		/* number of nonzeros in a column */

    double cknobs [COLAMD_KNOBS] ;		/* knobs for colamd */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs for colamd */

#ifndef NDEBUG
    colamd_get_debug ("symamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("symamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)
    {
    	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("symamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("symamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n < 0)		/* n must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n ;
	DEBUG0 (("symamd: n negative %d\n", n)) ;
    	return (FALSE) ;
    }

    nnz = p [n] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("symamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero ;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("symamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    /* === Allocate count and mark ========================================== */

    count = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!count)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	DEBUG0 (("symamd: allocate count (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    mark = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!mark)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	DEBUG0 (("symamd: allocate mark (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    /* === Compute column counts of M, check if A is valid ================== */

    stats [COLAMD_INFO3] = 0 ;  /* number of duplicate or unsorted row indices*/

    for (i = 0 ; i < n ; i++)
    {
    	mark [i] = -1 ;
    }

    for (j = 0 ; j < n ; j++)
    {
	last_row = -1 ;

	length = p [j+1] - p [j] ;
	if (length < 0)
	{
	    /* column pointers must be non-decreasing */
	    stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
	    stats [COLAMD_INFO1] = j ;
	    stats [COLAMD_INFO2] = length ;
	    (*release) ((void *) count) ;
	    (*release) ((void *) mark) ;
	    DEBUG0 (("symamd: col %d negative length %d\n", j, length)) ;
	    return (FALSE) ;
	}

	for (pp = p [j] ; pp < p [j+1] ; pp++)
	{
	    i = A [pp] ;
	    if (i < 0 || i >= n)
	    {
		/* row index i, in column j, is out of bounds */
		stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		stats [COLAMD_INFO3] = n ;
		(*release) ((void *) count) ;
		(*release) ((void *) mark) ;
		DEBUG0 (("symamd: row %d col %d out of bounds\n", i, j)) ;
		return (FALSE) ;
	    }

	    if (i <= last_row || mark [i] == j)
	    {
		/* row index is unsorted or repeated (or both), thus col */
		/* is jumbled.  This is a notice, not an error condition. */
		stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		(stats [COLAMD_INFO3]) ++ ;
		DEBUG1 (("symamd: row %d col %d unsorted/duplicate\n", i, j)) ;
	    }

	    if (i > j && mark [i] != j)
	    {
		/* row k of M will contain column indices i and j */
		count [i]++ ;
		count [j]++ ;
	    }

	    /* mark the row as having been seen in this column */
	    mark [i] = j ;

	    last_row = i ;
	}
    }

    /* v2.4: removed free(mark) */

    /* === Compute column pointers of M ===================================== */

    /* use output permutation, perm, for column pointers of M */
    perm [0] = 0 ;
    for (j = 1 ; j <= n ; j++)
    {
	perm [j] = perm [j-1] + count [j-1] ;
    }
    for (j = 0 ; j < n ; j++)
    {
	count [j] = perm [j] ;
    }

    /* === Construct M ====================================================== */

    mnz = perm [n] ;
    n_row = mnz / 2 ;
    Mlen = COLAMD_recommended (mnz, n_row, n) ;
    M = (Int *) ((*allocate) (Mlen, sizeof (Int))) ;
    DEBUG0 (("symamd: M is %d-by-%d with %d entries, Mlen = %g\n",
    	n_row, n, mnz, (double) Mlen)) ;

    if (!M)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	(*release) ((void *) mark) ;
	DEBUG0 (("symamd: allocate M (size %g) failed\n", (double) Mlen)) ;
	return (FALSE) ;
    }

    k = 0 ;

    if (stats [COLAMD_STATUS] == COLAMD_OK)
    {
	/* Matrix is OK */
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		}
	    }
	}
    }
    else
    {
	/* Matrix is jumbled.  Do not add duplicates to M.  Unsorted cols OK. */
	DEBUG0 (("symamd: Duplicates in A.\n")) ;
	for (i = 0 ; i < n ; i++)
	{
	    mark [i] = -1 ;
	}
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j && mark [i] != j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		    mark [i] = j ;
		}
	    }
	}
	/* v2.4: free(mark) moved below */
    }

    /* count and mark no longer needed */
    (*release) ((void *) count) ;
    (*release) ((void *) mark) ;	/* v2.4: free (mark) moved here */
    ASSERT (k == n_row) ;

    /* === Adjust the knobs for M =========================================== */

    for (i = 0 ; i < COLAMD_KNOBS ; i++)
    {
	cknobs [i] = knobs [i] ;
    }

    /* there are no dense rows in M */
    cknobs [COLAMD_DENSE_ROW] = -1 ;
    cknobs [COLAMD_DENSE_COL] = knobs [COLAMD_DENSE_ROW] ;

    /* === Order the columns of M =========================================== */

    /* v2.4: colamd cannot fail here, so the error check is removed */
    (void) COLAMD_MAIN (n_row, n, (Int) Mlen, M, perm, cknobs, stats) ;

    /* Note that the output permutation is now in perm */

    /* === get the statistics for symamd from colamd ======================== */

    /* a dense column in colamd means a dense row and col in symamd */
    stats [COLAMD_DENSE_ROW] = stats [COLAMD_DENSE_COL] ;

    /* === Free M =========================================================== */

    (*release) ((void *) M) ;
    DEBUG0 (("symamd: done.\n")) ;
    return (TRUE) ;

}